

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_hkdf(void)

{
  ptls_hash_algorithm_t *algo;
  int iVar1;
  ptls_cipher_suite_t *ppVar2;
  ptls_iovec_t pVar3;
  ptls_iovec_t pVar4;
  undefined1 local_b8 [8];
  uint8_t okm [42];
  uint8_t prk [64];
  char info [11];
  char ikm [23];
  char salt [14];
  ptls_hash_algorithm_t *sha256;
  
  ppVar2 = find_cipher(ctx,0x1301);
  algo = ppVar2->hash;
  stack0xffffffffffffffe2 = 0x706050403020100;
  info[3] = '\v';
  info[4] = '\v';
  info[5] = '\v';
  info[6] = '\v';
  info[7] = '\v';
  info[8] = '\v';
  info[9] = '\v';
  info[10] = '\v';
  ikm[0] = '\v';
  ikm[1] = '\v';
  ikm[2] = '\v';
  ikm[3] = '\v';
  ikm[4] = '\v';
  ikm[5] = '\v';
  ikm[6] = '\v';
  ikm[7] = '\v';
  ikm[8] = '\v';
  ikm[9] = '\v';
  ikm[10] = '\v';
  ikm[0xb] = '\v';
  ikm[0xc] = '\v';
  ikm[0xd] = '\v';
  ikm[0xe] = '\0';
  stack0xffffffffffffffbd = 0xf7f6f5f4f3f2f1f0;
  info[0] = -8;
  info[1] = -7;
  info[2] = '\0';
  pVar3 = ptls_iovec_init(ikm + 0x12,0xd);
  pVar4 = ptls_iovec_init(info + 3,0x16);
  ptls_hkdf_extract(algo,okm + 0x28,pVar3,pVar4);
  iVar1 = memcmp(okm + 0x28,anon_var_dwarf_b930,0x20);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x79);
  pVar3 = ptls_iovec_init(okm + 0x28,algo->digest_size);
  pVar4 = ptls_iovec_init(prk + 0x3d,10);
  ptls_hkdf_expand(algo,local_b8,0x2a,pVar3,pVar4);
  iVar1 = memcmp(local_b8,anon_var_dwarf_b93b,0x2a);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x7f);
  return;
}

Assistant:

static void test_hkdf(void)
{
    ptls_hash_algorithm_t *sha256 = find_cipher(ctx, PTLS_CIPHER_SUITE_AES_128_GCM_SHA256)->hash;
    const char salt[] = "\x00\x01\x02\x03\x04\x05\x06\x07\x08\x09\x0a\x0b\x0c";
    const char ikm[] = "\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b";
    const char info[] = "\xf0\xf1\xf2\xf3\xf4\xf5\xf6\xf7\xf8\xf9";
    uint8_t prk[PTLS_MAX_DIGEST_SIZE];
    uint8_t okm[42];

    ptls_hkdf_extract(sha256, prk, ptls_iovec_init(salt, sizeof(salt) - 1), ptls_iovec_init(ikm, sizeof(ikm) - 1));
    ok(memcmp(prk,
              "\x07\x77\x09\x36\x2c\x2e\x32\xdf\x0d\xdc\x3f\x0d\xc4\x7b\xba\x63\x90\xb6\xc7\x3b\xb5\x0f\x9c\x31\x22\xec\x84"
              "\x4a\xd7\xc2\xb3\xe5",
              32) == 0);

    ptls_hkdf_expand(sha256, okm, sizeof(okm), ptls_iovec_init(prk, sha256->digest_size), ptls_iovec_init(info, sizeof(info) - 1));
    ok(memcmp(okm,
              "\x3c\xb2\x5f\x25\xfa\xac\xd5\x7a\x90\x43\x4f\x64\xd0\x36\x2f\x2a\x2d\x2d\x0a\x90\xcf\x1a\x5a\x4c\x5d\xb0\x2d"
              "\x56\xec\xc4\xc5\xbf\x34\x00\x72\x08\xd5\xb8\x87\x18\x58\x65",
              sizeof(okm)) == 0);
}